

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.cc
# Opt level: O0

undefined8
load_string_abi_cxx11_
          (bool use_colors,bool use_powerline_left,bool use_powerline_right,short num_averages,
          bool segments_to_right,short right_color)

{
  long lVar1;
  uint32_t uVar2;
  ostream *poVar3;
  undefined6 in_register_0000000a;
  double *__loadavg;
  undefined7 in_register_00000011;
  int iVar4;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  undefined7 in_register_00000081;
  float fVar5;
  double dStackY_210;
  double dStackY_208;
  ostream *local_200;
  undefined8 in_stack_fffffffffffffe08;
  double dVar6;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  double *local_1e8;
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined8 local_1d0;
  undefined8 local_1c8;
  float local_1c0;
  int local_1bc;
  float avg;
  int i;
  uint load_percent;
  unsigned_long __vla_expr0;
  long local_190;
  ostringstream ss;
  undefined1 uStack_16d;
  POWERLINE_DIRECTION PStack_16c;
  undefined8 auStack_168 [42];
  byte local_17;
  ushort local_16;
  byte local_13;
  byte local_12;
  byte local_11;
  bool segments_to_right_local;
  short num_averages_local;
  bool use_powerline_right_local;
  bool use_powerline_left_local;
  undefined8 uStack_10;
  bool use_colors_local;
  
  local_1d0 = CONCAT71(in_register_00000039,use_colors);
  local_1e0 = (undefined4)CONCAT71(in_register_00000081,segments_to_right);
  local_1dc = (undefined4)CONCAT62(in_register_0000000a,num_averages);
  local_1d8 = (undefined4)CONCAT71(in_register_00000011,use_powerline_right);
  local_1d4 = (undefined4)CONCAT71(in_register_00000031,use_powerline_left);
  local_13 = (byte)num_averages & 1;
  local_16 = (ushort)CONCAT71(in_register_00000081,segments_to_right);
  local_17 = (byte)right_color & 1;
  dStackY_210 = 5.33984667828282e-318;
  local_1c8 = local_1d0;
  local_12 = use_powerline_right;
  local_11 = use_powerline_left;
  uStack_10 = local_1d0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  dStackY_210 = 5.3400146606024e-318;
  std::ios_base::setf((ios_base *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                      (fmtflags)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                      (fmtflags)in_stack_fffffffffffffe08);
  dStackY_210 = 5.34016782095261e-318;
  std::ios_base::precision((ios_base *)((long)&local_190 + *(long *)(local_190 + -0x18)),2);
  _load_percent = (ulong)local_16;
  lVar1 = -(ulong)((uint)local_16 * 8 + 0xf & 0xfffffff0);
  __loadavg = (double *)((long)&dStackY_208 + lVar1);
  local_1e8 = __loadavg;
  if (((short)local_16 < 1) || (3 < (short)local_16)) {
    __vla_expr0 = (unsigned_long)&dStackY_208;
    *(undefined8 *)((long)&dStackY_210 + lVar1) = 0x107e75;
    std::operator<<((ostream *)&local_190,'\0');
    *(undefined8 *)((long)&dStackY_210 + lVar1) = 0x107e8a;
    std::__cxx11::ostringstream::str();
  }
  else {
    iVar4 = (int)(short)local_16;
    __vla_expr0 = (unsigned_long)&dStackY_208;
    *(undefined8 *)((long)&dStackY_210 + lVar1) = 0x107ece;
    iVar4 = getloadavg(__loadavg,iVar4);
    if (iVar4 < 0) {
      *(undefined8 *)((long)&dStackY_210 + lVar1) = 0x107ee6;
      std::operator<<((ostream *)&local_190," 0.00 0.00 0.00");
    }
    else {
      dVar6 = *local_1e8;
      *(undefined8 *)((long)&dStackY_210 + lVar1) = 0x107f05;
      uVar2 = get_cpu_count();
      avg = (float)(long)((dVar6 / (double)uVar2) * 0.5 * 100.0);
      if (100 < (uint)avg) {
        avg = 1.4013e-43;
      }
      if ((local_11 & 1) != 0) {
        if ((local_13 & 1) == 0) {
          if ((local_12 & 1) == 0) {
            *(undefined8 *)((long)&dStackY_210 + lVar1) = 0x107fec;
            powerline(*(ostringstream **)((long)auStack_168 + lVar1 + 8),
                      *(char **)((long)auStack_168 + lVar1),
                      *(POWERLINE_DIRECTION *)((long)auStack_168 + lVar1 + -4),
                      (bool)(&uStack_16d)[lVar1]);
          }
          else {
            *(undefined8 *)((long)&dStackY_210 + lVar1) = 0x107fc4;
            powerline(*(ostringstream **)((long)auStack_168 + lVar1 + 8),
                      *(char **)((long)auStack_168 + lVar1),
                      *(POWERLINE_DIRECTION *)((long)auStack_168 + lVar1 + -4),
                      (bool)(&uStack_16d)[lVar1]);
          }
        }
        else {
          *(undefined8 *)((long)&dStackY_210 + lVar1) = 0x107f93;
          powerline(*(ostringstream **)((long)auStack_168 + lVar1 + 8),
                    *(char **)((long)auStack_168 + lVar1),
                    *(POWERLINE_DIRECTION *)((long)auStack_168 + lVar1 + -4),
                    (bool)(&uStack_16d)[lVar1]);
        }
      }
      *(undefined8 *)((long)&dStackY_210 + lVar1) = 0x108005;
      std::operator<<((ostream *)&local_190,' ');
      for (local_1bc = 0; local_1bc < (short)local_16; local_1bc = local_1bc + 1) {
        dVar6 = local_1e8[local_1bc];
        *(undefined8 *)((long)&dStackY_210 + lVar1) = 0x10805f;
        fVar5 = floorf((float)dVar6 * 100.0 + 0.5);
        fVar5 = fVar5 / 100.0;
        local_1c0 = fVar5;
        if (local_1bc == (short)local_16 + -1) {
          *(undefined8 *)((long)&dStackY_210 + lVar1) = 0x108098;
          std::ostream::operator<<(&local_190,fVar5);
        }
        else {
          *(undefined8 *)((long)&dStackY_210 + lVar1) = 0x1080b0;
          poVar3 = (ostream *)std::ostream::operator<<(&local_190,fVar5);
          local_200 = poVar3;
          *(undefined8 *)((long)&dStackY_210 + lVar1) = 0x1080cc;
          std::operator<<(poVar3," ");
        }
      }
      if ((local_11 & 1) != 0) {
        if (((local_12 & 1) == 0) || ((local_17 & 1) == 0)) {
          if (((local_12 & 1) == 0) || ((local_17 & 1) != 0)) {
            if ((local_13 & 1) == 0) {
              *(undefined8 *)((long)&dStackY_210 + lVar1) = 0x1081c5;
              std::operator<<((ostream *)&local_190,"#[fg=default,bg=default]");
            }
            else if (((local_17 & 1) != 0) && ((local_13 & 1) != 0)) {
              *(undefined8 *)((long)&dStackY_210 + lVar1) = 0x108204;
              powerline_char(*(ostringstream **)((long)&local_1e0 + lVar1),
                             *(char **)((long)&local_1e8 + lVar1),
                             *(short *)(&stack0xfffffffffffffe16 + lVar1),
                             *(POWERLINE_DIRECTION *)(&stack0xfffffffffffffe10 + lVar1),
                             (bool)(&stack0xfffffffffffffe0f)[lVar1]);
            }
          }
          else {
            *(undefined8 *)((long)&dStackY_210 + lVar1) = 0x10818c;
            powerline(*(ostringstream **)((long)auStack_168 + lVar1 + 8),
                      *(char **)((long)auStack_168 + lVar1),
                      *(POWERLINE_DIRECTION *)((long)auStack_168 + lVar1 + -4),
                      (bool)(&uStack_16d)[lVar1]);
            *(undefined8 *)((long)&dStackY_210 + lVar1) = 0x1081a8;
            powerline(*(ostringstream **)((long)auStack_168 + lVar1 + 8),
                      *(char **)((long)auStack_168 + lVar1),
                      *(POWERLINE_DIRECTION *)((long)auStack_168 + lVar1 + -4),
                      (bool)(&uStack_16d)[lVar1]);
          }
        }
        else {
          *(undefined8 *)((long)&dStackY_210 + lVar1) = 0x108123;
          powerline(*(ostringstream **)((long)auStack_168 + lVar1 + 8),
                    *(char **)((long)auStack_168 + lVar1),
                    *(POWERLINE_DIRECTION *)((long)auStack_168 + lVar1 + -4),
                    (bool)(&uStack_16d)[lVar1]);
          *(undefined8 *)((long)&dStackY_210 + lVar1) = 0x108152;
          powerline_char(*(ostringstream **)((long)&local_1e0 + lVar1),
                         *(char **)((long)&local_1e8 + lVar1),
                         *(short *)(&stack0xfffffffffffffe16 + lVar1),
                         *(POWERLINE_DIRECTION *)(&stack0xfffffffffffffe10 + lVar1),
                         (bool)(&stack0xfffffffffffffe0f)[lVar1]);
        }
      }
    }
    *(undefined8 *)((long)&dStackY_210 + lVar1) = 0x108225;
    std::__cxx11::ostringstream::str();
  }
  i = 1;
  *(undefined8 *)(__vla_expr0 - 8) = 0x108247;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return local_1c8;
}

Assistant:

std::string load_string( bool use_colors,
  bool use_powerline_left, bool use_powerline_right, short num_averages,
  bool segments_to_right, short right_color )
{
  std::ostringstream ss;
  ss.setf( std::ios::fixed, std::ios::floatfield );
  ss.precision( 2 );
  double averages[num_averages];
  // based on: opensource.apple.com/source/Libc/Libc-262/gen/getloadavg.c

  if( num_averages <= 0 || num_averages > 3)
  {
    ss << (char) 0;
    return ss.str();
  }

  if( getloadavg( averages, num_averages ) < 0 )
  {
    ss << " 0.00 0.00 0.00"; // couldn't get averages.
  }
  else
  {
    unsigned load_percent = static_cast<unsigned int>( averages[0] /
        get_cpu_count() * 0.5f * 100.0f );

    if( load_percent > 100 )
    {
      load_percent = 100;
    }
    if( use_colors )
    {
      if( use_powerline_right )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_RIGHT );
      }
      else if( use_powerline_left )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_LEFT );
      }
      else
      {
        powerline( ss, load_lut[load_percent], NONE );
      }
    }

    ss << ' ';
    for( int i = 0; i < num_averages; ++i )
    {
      // Round to nearest, make sure this is only a 0.00 value not a 0.0000
      float avg = floorf( static_cast<float>( averages[i] ) * 100 + 0.5 ) / 100;
      // Don't print trailing whitespace for last element
      if ( i == num_averages-1 )
      {
        ss << avg;
      }
      else
      {
        ss << avg << " ";
      }
    }

    if( use_colors )
    {
      if( use_powerline_left && segments_to_right )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_LEFT, true );
        powerline_char( ss, load_lut[load_percent], right_color, POWERLINE_LEFT, true );
      }
      else if( use_powerline_left && !segments_to_right )
      {
        powerline( ss, load_lut[load_percent], POWERLINE_LEFT, true );
        powerline( ss, "#[fg=default,bg=default]", POWERLINE_LEFT );
      }
      else if( !use_powerline_right )
      {
        ss << "#[fg=default,bg=default]";
      }
      else if ( segments_to_right && use_powerline_right )
      {
        powerline_char( ss, load_lut[load_percent], right_color, POWERLINE_RIGHT, true );
      }
    }
  }

  return ss.str();
}